

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O2

void __thiscall StackLattice_Compare_Test::TestBody(StackLattice_Compare_Test *this)

{
  initializer_list<wasm::analysis::Flat<unsigned_int>::Element> __l;
  initializer_list<wasm::analysis::Flat<unsigned_int>::Element> __l_00;
  initializer_list<wasm::analysis::Flat<unsigned_int>::Element> __l_01;
  _Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
  local_a8;
  undefined1 local_a4;
  undefined4 local_a0;
  undefined1 local_9c;
  _Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
  local_98;
  undefined1 local_94;
  undefined4 local_90;
  undefined1 local_8c;
  _Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
  local_88;
  undefined1 local_84;
  _Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  local_80;
  _Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  local_68;
  _Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  local_50;
  _Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  local_38;
  Stack<wasm::analysis::Flat<unsigned_int>_> local_1c;
  allocator_type local_1b;
  allocator_type local_1a;
  allocator_type local_19 [5];
  Stack<wasm::analysis::Flat<unsigned_int>_> stack;
  
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88 = (_Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
              )0x0;
  local_84 = 1;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_88;
  std::
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::vector((vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
            *)&local_80,__l,&local_1b);
  local_a8 = (_Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
              )0x0;
  local_a4 = 1;
  local_a0 = 1;
  local_9c = 1;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_a8;
  std::
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::vector((vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
            *)&local_68,__l_00,&local_1a);
  local_98 = (_Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
              )0x0;
  local_94 = 1;
  local_8c = 2;
  local_90 = 0;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_98;
  std::
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::vector((vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
            *)&local_50,__l_01,local_19);
  testDiamondCompare<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>
            (&local_1c,(Element *)&local_38,(Element *)&local_80,(Element *)&local_68,
             (Element *)&local_50);
  std::
  _Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::~_Vector_base(&local_50);
  std::
  _Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::~_Vector_base(&local_68);
  std::
  _Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::~_Vector_base(&local_80);
  std::
  _Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::~_Vector_base(&local_38);
  return;
}

Assistant:

TEST(StackLattice, Compare) {
  analysis::Stack stack{analysis::Flat<uint32_t>{}};
  auto& flat = stack.lattice;
  testDiamondCompare(stack,
                     {},
                     {flat.get(0)},
                     {flat.get(0), flat.get(1)},
                     {flat.get(0), flat.getTop()});
}